

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.cxx
# Opt level: O0

bool IncludeByVariable(cmExecutionStatus *status,string *variable)

{
  bool bVar1;
  cmMakefile *this;
  string *psVar2;
  string *in_base;
  cmAlphaNum local_1f0;
  cmAlphaNum local_1c0;
  string local_190;
  undefined1 local_169;
  undefined1 local_168 [7];
  bool readit;
  cmAlphaNum local_138;
  string local_108;
  undefined4 local_e4;
  cmAlphaNum local_e0;
  cmAlphaNum local_b0;
  string local_80;
  undefined1 local_50 [8];
  string includeFile;
  cmValue include;
  cmMakefile *mf;
  string *variable_local;
  cmExecutionStatus *status_local;
  
  this = cmExecutionStatus::GetMakefile(status);
  includeFile.field_2._8_8_ = cmMakefile::GetDefinition(this,variable);
  bVar1 = cmValue::operator_cast_to_bool((cmValue *)((long)&includeFile.field_2 + 8));
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&includeFile.field_2 + 8));
    in_base = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
    cmsys::SystemTools::CollapseFullPath((string *)local_50,psVar2,in_base);
    bVar1 = cmsys::SystemTools::FileExists((string *)local_50);
    if (bVar1) {
      bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_50);
      if (bVar1) {
        cmAlphaNum::cmAlphaNum(&local_138,"requested file is a directory:\n  ");
        psVar2 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&includeFile.field_2 + 8));
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_168,psVar2);
        cmStrCat<>(&local_108,&local_138,(cmAlphaNum *)local_168);
        cmExecutionStatus::SetError(status,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        status_local._7_1_ = false;
      }
      else {
        psVar2 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&includeFile.field_2 + 8));
        local_169 = cmMakefile::ReadDependentFile(this,psVar2,true);
        if ((bool)local_169) {
          status_local._7_1_ = true;
        }
        else {
          bVar1 = cmSystemTools::GetFatalErrorOccurred();
          if (bVar1) {
            status_local._7_1_ = true;
          }
          else {
            cmAlphaNum::cmAlphaNum(&local_1c0,"could not load requested file:\n  ");
            psVar2 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&includeFile.field_2 + 8));
            cmAlphaNum::cmAlphaNum(&local_1f0,psVar2);
            cmStrCat<>(&local_190,&local_1c0,&local_1f0);
            cmExecutionStatus::SetError(status,&local_190);
            std::__cxx11::string::~string((string *)&local_190);
            status_local._7_1_ = false;
          }
        }
      }
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_b0,"could not find requested file:\n  ");
      psVar2 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&includeFile.field_2 + 8));
      cmAlphaNum::cmAlphaNum(&local_e0,psVar2);
      cmStrCat<>(&local_80,&local_b0,&local_e0);
      cmExecutionStatus::SetError(status,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      status_local._7_1_ = false;
    }
    local_e4 = 1;
    std::__cxx11::string::~string((string *)local_50);
  }
  else {
    status_local._7_1_ = true;
  }
  return status_local._7_1_;
}

Assistant:

static bool IncludeByVariable(cmExecutionStatus& status,
                              const std::string& variable)
{
  cmMakefile& mf = status.GetMakefile();
  cmValue include = mf.GetDefinition(variable);
  if (!include) {
    return true;
  }

  std::string includeFile =
    cmSystemTools::CollapseFullPath(*include, mf.GetCurrentSourceDirectory());
  if (!cmSystemTools::FileExists(includeFile)) {
    status.SetError(cmStrCat("could not find requested file:\n  ", *include));
    return false;
  }
  if (cmSystemTools::FileIsDirectory(includeFile)) {
    status.SetError(cmStrCat("requested file is a directory:\n  ", *include));
    return false;
  }

  const bool readit = mf.ReadDependentFile(*include);
  if (readit) {
    return true;
  }

  if (cmSystemTools::GetFatalErrorOccurred()) {
    return true;
  }

  status.SetError(cmStrCat("could not load requested file:\n  ", *include));
  return false;
}